

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O2

int archive_write_ar_header(archive_write *a,archive_entry *entry)

{
  char cVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  mode_t mVar6;
  char *pcVar7;
  size_t sVar8;
  char *__s;
  char *pcVar9;
  char *pcVar10;
  time_t v;
  int64_t iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int64_t local_88;
  char buff [60];
  
  plVar2 = (long *)a->format_data;
  *(undefined4 *)(plVar2 + 2) = 0;
  local_88 = archive_entry_size(entry);
  pcVar7 = archive_entry_pathname(entry);
  if ((pcVar7 == (char *)0x0) || (cVar1 = *pcVar7, cVar1 == '\0')) {
LAB_00148d68:
    pcVar7 = "Invalid filename";
    goto LAB_00148d6f;
  }
  if ((char)plVar2[3] == '\0') {
    __archive_write_output(a,"!<arch>\n",8);
    *(undefined1 *)(plVar2 + 3) = 1;
    cVar1 = *pcVar7;
  }
  builtin_strncpy(buff,"                                                          `\n",0x3c);
  if ((cVar1 == '/') && (pcVar7[1] == '\0')) {
    builtin_strncpy(buff,"/       ",8);
LAB_00148e23:
    bVar3 = false;
    __s = (char *)0x0;
LAB_00148f83:
    v = archive_entry_mtime(entry);
    iVar5 = format_decimal(v,buff + 0x10,0xc);
    if (iVar5 == 0) {
      iVar11 = archive_entry_uid(entry);
      iVar5 = format_decimal(iVar11,buff + 0x1c,6);
      if (iVar5 == 0) {
        iVar11 = archive_entry_gid(entry);
        iVar5 = format_decimal(iVar11,buff + 0x22,6);
        if (iVar5 == 0) {
          mVar6 = archive_entry_mode(entry);
          uVar4 = (ulong)mVar6;
          lVar14 = 0;
          uVar15 = 8;
          do {
            lVar13 = lVar14;
            uVar12 = uVar4;
            buff[lVar13 + 0x2f] = (byte)uVar12 & 7 | 0x30;
            uVar16 = uVar15 - 1;
            lVar14 = lVar13 + -1;
            if (uVar15 < 2) break;
            uVar4 = uVar12 >> 3;
            uVar15 = uVar16;
          } while (7 < uVar12);
          if (uVar12 < 8) {
            memmove(buff + 0x28,buff + lVar13 + 0x2f,-lVar14);
            pcVar7 = buff + 0x28 + -lVar14;
            for (; 0 < (int)uVar16; uVar16 = uVar16 - 1) {
              *pcVar7 = ' ';
              pcVar7 = pcVar7 + 1;
            }
            if (__s == (char *)0x0) {
              __s = (char *)0x0;
            }
            else {
              mVar6 = archive_entry_filetype(entry);
              if (mVar6 != 0x8000) {
                pcVar7 = "Regular file required for non-pseudo member";
                goto LAB_00148d6f;
              }
            }
            goto LAB_00148e7a;
          }
          for (lVar13 = 0; (int)lVar13 != 8; lVar13 = lVar13 + 1) {
            buff[lVar14 + lVar13 + 0x30] = '7';
          }
          pcVar7 = "Numeric mode too large";
        }
        else {
          pcVar7 = "Numeric group ID too large";
        }
      }
      else {
        pcVar7 = "Numeric user ID too large";
      }
    }
    else {
      pcVar7 = "File modification time too large";
    }
  }
  else {
    iVar5 = strcmp(pcVar7,"__.SYMDEF");
    if (iVar5 == 0) {
      builtin_strncpy(buff,"__.SYMDE",8);
      buff[8] = 'F';
      goto LAB_00148e23;
    }
    if (((cVar1 == '/') && (pcVar7[1] == '/')) && (pcVar7[2] == '\0')) {
      *(undefined4 *)(plVar2 + 2) = 1;
      buff[0] = '/';
      buff[1] = '/';
      bVar3 = false;
      __s = (char *)0x0;
LAB_00148e7a:
      iVar5 = format_decimal(local_88,buff + 0x30,10);
      if (iVar5 == 0) {
        iVar5 = __archive_write_output(a,buff,0x3c);
        if (iVar5 != 0) {
          return iVar5;
        }
        *plVar2 = local_88;
        plVar2[1] = (ulong)((uint)local_88 & 1);
        if (!bVar3) {
          return 0;
        }
        sVar8 = strlen(__s);
        iVar5 = __archive_write_output(a,__s,sVar8);
        if (iVar5 != 0) {
          return iVar5;
        }
        sVar8 = strlen(__s);
        *plVar2 = *plVar2 - sVar8;
        return 0;
      }
      pcVar7 = "File size out of range";
    }
    else {
      sVar8 = strlen(pcVar7);
      if (pcVar7[sVar8 - 1] == '/') goto LAB_00148d68;
      pcVar9 = pcVar7 + sVar8;
      do {
        __s = pcVar9 + -1;
        if (__s <= pcVar7) break;
        pcVar10 = pcVar9 + -2;
        pcVar9 = __s;
      } while (*pcVar10 != '/');
      iVar5 = (a->archive).archive_format;
      if (iVar5 == 0x70001) {
        sVar8 = strlen(__s);
        if (sVar8 < 0x10) {
          strncpy(buff,__s,sVar8);
          sVar8 = strlen(__s);
          buff[sVar8] = '/';
          goto LAB_00148f80;
        }
        if (*(int *)((long)plVar2 + 0x14) < 1) {
          pcVar7 = "Can\'t find string table";
        }
        else {
          pcVar7 = (char *)malloc(sVar8 + 3);
          if (pcVar7 == (char *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate filename buffer");
            return -0x1e;
          }
          strncpy(pcVar7,__s,sVar8);
          sVar8 = strlen(__s);
          (pcVar7 + sVar8)[0] = '/';
          (pcVar7 + sVar8)[1] = '\n';
          pcVar7[sVar8 + 2] = '\0';
          pcVar9 = (char *)plVar2[4];
          pcVar10 = strstr(pcVar9,pcVar7);
          free(pcVar7);
          if (pcVar10 != (char *)0x0) {
            buff[0] = '/';
            iVar5 = format_decimal((long)pcVar10 - (long)pcVar9,buff + 1,0xf);
            if (iVar5 != 0) {
              pcVar7 = "string table offset too large";
              goto LAB_001490c7;
            }
            goto LAB_00148f80;
          }
          pcVar7 = "Invalid string table";
        }
LAB_00148d6f:
        iVar5 = 0x16;
        goto LAB_001490c9;
      }
      if (iVar5 != 0x70002) {
LAB_00148f80:
        bVar3 = false;
        goto LAB_00148f83;
      }
      sVar8 = strlen(__s);
      if ((sVar8 < 0x11) && (pcVar7 = strchr(__s,0x20), pcVar7 == (char *)0x0)) {
        strncpy(buff,__s,sVar8);
        sVar8 = strlen(__s);
        buff[sVar8] = ' ';
        goto LAB_00148f80;
      }
      buff[0] = '\0';
      buff[1] = '\0';
      buff[2] = '/';
      buff[0] = '#';
      buff[1] = '1';
      iVar5 = format_decimal(sVar8,buff + 3,0xd);
      if (iVar5 == 0) {
        sVar8 = strlen(__s);
        local_88 = local_88 + sVar8;
        bVar3 = true;
        goto LAB_00148f83;
      }
      pcVar7 = "File name too long";
    }
  }
LAB_001490c7:
  iVar5 = 0x22;
LAB_001490c9:
  archive_set_error(&a->archive,iVar5,pcVar7);
  return -0x14;
}

Assistant:

static int
archive_write_ar_header(struct archive_write *a, struct archive_entry *entry)
{
	int ret, append_fn;
	char buff[60];
	char *ss, *se;
	struct ar_w *ar;
	const char *pathname;
	const char *filename;
	int64_t size;

	append_fn = 0;
	ar = (struct ar_w *)a->format_data;
	ar->is_strtab = 0;
	filename = NULL;
	size = archive_entry_size(entry);


	/*
	 * Reject files with empty name.
	 */
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL || *pathname == '\0') {
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	/*
	 * If we are now at the beginning of the archive,
	 * we need first write the ar global header.
	 */
	if (!ar->wrote_global_header) {
		__archive_write_output(a, "!<arch>\n", 8);
		ar->wrote_global_header = 1;
	}

	memset(buff, ' ', 60);
	strncpy(&buff[AR_fmag_offset], "`\n", 2);

	if (strcmp(pathname, "/") == 0 ) {
		/* Entry is archive symbol table in GNU format */
		buff[AR_name_offset] = '/';
		goto stat;
	}
	if (strcmp(pathname, "__.SYMDEF") == 0) {
		/* Entry is archive symbol table in BSD format */
		strncpy(buff + AR_name_offset, "__.SYMDEF", 9);
		goto stat;
	}
	if (strcmp(pathname, "//") == 0) {
		/*
		 * Entry is archive filename table, inform that we should
		 * collect strtab in next _data call.
		 */
		ar->is_strtab = 1;
		buff[AR_name_offset] = buff[AR_name_offset + 1] = '/';
		/*
		 * For archive string table, only ar_size field should
		 * be set.
		 */
		goto size;
	}

	/*
	 * Otherwise, entry is a normal archive member.
	 * Strip leading paths from filenames, if any.
	 */
	if ((filename = ar_basename(pathname)) == NULL) {
		/* Reject filenames with trailing "/" */
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU) {
		/*
		 * SVR4/GNU variant use a "/" to mark then end of the filename,
		 * make it possible to have embedded spaces in the filename.
		 * So, the longest filename here (without extension) is
		 * actually 15 bytes.
		 */
		if (strlen(filename) <= 15) {
			strncpy(&buff[AR_name_offset], 
			    filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = '/';
		} else {
			/*
			 * For filename longer than 15 bytes, GNU variant
			 * makes use of a string table and instead stores the
			 * offset of the real filename to in the ar_name field.
			 * The string table should have been written before.
			 */
			if (ar->has_strtab <= 0) {
				archive_set_error(&a->archive, EINVAL,
				    "Can't find string table");
				return (ARCHIVE_WARN);
			}

			se = (char *)malloc(strlen(filename) + 3);
			if (se == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate filename buffer");
				return (ARCHIVE_FATAL);
			}

			strncpy(se, filename, strlen(filename));
			strcpy(se + strlen(filename), "/\n");

			ss = strstr(ar->strtab, se);
			free(se);

			if (ss == NULL) {
				archive_set_error(&a->archive, EINVAL,
				    "Invalid string table");
				return (ARCHIVE_WARN);
			}

			/*
			 * GNU variant puts "/" followed by digits into
			 * ar_name field. These digits indicates the real
			 * filename string's offset to the string table.
			 */
			buff[AR_name_offset] = '/';
			if (format_decimal(ss - ar->strtab,
			    buff + AR_name_offset + 1,
			    AR_name_size - 1)) {
				archive_set_error(&a->archive, ERANGE,
				    "string table offset too large");
				return (ARCHIVE_WARN);
			}
		}
	} else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD) {
		/*
		 * BSD variant: for any file name which is more than
		 * 16 chars or contains one or more embedded space(s), the
		 * string "#1/" followed by the ASCII length of the name is
		 * put into the ar_name field. The file size (stored in the
		 * ar_size field) is incremented by the length of the name.
		 * The name is then written immediately following the
		 * archive header.
		 */
		if (strlen(filename) <= 16 && strchr(filename, ' ') == NULL) {
			strncpy(&buff[AR_name_offset], filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = ' ';
		}
		else {
			strncpy(buff + AR_name_offset, "#1/", 3);
			if (format_decimal(strlen(filename),
			    buff + AR_name_offset + 3,
			    AR_name_size - 3)) {
				archive_set_error(&a->archive, ERANGE,
				    "File name too long");
				return (ARCHIVE_WARN);
			}
			append_fn = 1;
			size += strlen(filename);
		}
	}

stat:
	if (format_decimal(archive_entry_mtime(entry), buff + AR_date_offset, AR_date_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_uid(entry), buff + AR_uid_offset, AR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_gid(entry), buff + AR_gid_offset, AR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_octal(archive_entry_mode(entry), buff + AR_mode_offset, AR_mode_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		return (ARCHIVE_WARN);
	}
	/*
	 * Sanity Check: A non-pseudo archive member should always be
	 * a regular file.
	 */
	if (filename != NULL && archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, EINVAL,
		    "Regular file required for non-pseudo member");
		return (ARCHIVE_WARN);
	}

size:
	if (format_decimal(size, buff + AR_size_offset, AR_size_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, buff, 60);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining = size;
	ar->entry_padding = ar->entry_bytes_remaining % 2;

	if (append_fn > 0) {
		ret = __archive_write_output(a, filename, strlen(filename));
		if (ret != ARCHIVE_OK)
			return (ret);
		ar->entry_bytes_remaining -= strlen(filename);
	}

	return (ARCHIVE_OK);
}